

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O1

void __thiscall Fl_Text_Display::redisplay_range(Fl_Text_Display *this,int startpos,int endpos)

{
  int iVar1;
  int iVar2;
  
  iVar1 = this->damage_range1_start;
  if ((iVar1 == -1) && (this->damage_range1_end == -1)) {
    this->damage_range1_start = startpos;
  }
  else {
    iVar2 = this->damage_range1_end;
    if ((iVar2 < startpos || startpos < iVar1) && (iVar2 < endpos || endpos < iVar1)) {
      iVar1 = this->damage_range2_start;
      if ((iVar1 == -1) && (this->damage_range2_end == -1)) {
        this->damage_range2_start = startpos;
      }
      else {
        if (iVar1 < startpos) {
          startpos = iVar1;
        }
        this->damage_range2_start = startpos;
        if (endpos < this->damage_range2_end) {
          endpos = this->damage_range2_end;
        }
      }
      this->damage_range2_end = endpos;
      goto LAB_001d227e;
    }
    if (iVar1 < startpos) {
      startpos = iVar1;
    }
    this->damage_range1_start = startpos;
    if (endpos < iVar2) {
      endpos = iVar2;
    }
  }
  this->damage_range1_end = endpos;
LAB_001d227e:
  Fl_Widget::damage((Fl_Widget *)this,'\x04');
  return;
}

Assistant:

void Fl_Text_Display::redisplay_range(int startpos, int endpos) {
  IS_UTF8_ALIGNED2(buffer(), startpos)
  IS_UTF8_ALIGNED2(buffer(), endpos)

  if (damage_range1_start == -1 && damage_range1_end == -1) {
    damage_range1_start = startpos;
    damage_range1_end = endpos;
  } else if ((startpos >= damage_range1_start && startpos <= damage_range1_end) ||
             (endpos >= damage_range1_start && endpos <= damage_range1_end)) {
    damage_range1_start = min(damage_range1_start, startpos);
    damage_range1_end = max(damage_range1_end, endpos);
  } else if (damage_range2_start == -1 && damage_range2_end == -1) {
    damage_range2_start = startpos;
    damage_range2_end = endpos;
  } else {
    damage_range2_start = min(damage_range2_start, startpos);
    damage_range2_end = max(damage_range2_end, endpos);
  }
  damage(FL_DAMAGE_SCROLL);
}